

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::DescriptorScriptPubKeyMan::GetDescriptorString
          (DescriptorScriptPubKeyMan *this,string *out,bool priv)

{
  byte bVar1;
  int iVar2;
  element_type *peVar3;
  byte in_DL;
  char *in_RSI;
  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock78;
  FlatSigningProvider provider;
  FlatSigningProvider *in_stack_fffffffffffffe78;
  undefined5 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe85;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 in_stack_fffffffffffffe9b;
  int in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea0;
  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *mutexIn;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffee0;
  undefined1 local_100 [248];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  mutexIn = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
             (AnnotatedMixin<std::recursive_mutex> *)mutexIn,in_RSI,
             (char *)CONCAT17(bVar1,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
             (bool)in_stack_fffffffffffffe9b);
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffe78);
  GetKeys(in_stack_fffffffffffffee0);
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
  operator=(in_RDI,(map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe87,
                               CONCAT16(in_stack_fffffffffffffe86,
                                        CONCAT15(in_stack_fffffffffffffe85,in_stack_fffffffffffffe80
                                                ))));
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::~map
            ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              *)in_stack_fffffffffffffe78);
  if ((bVar1 & 1) == 0) {
    peVar3 = std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )in_stack_fffffffffffffe78);
    iVar2 = (*peVar3->_vptr_Descriptor[7])
                      (peVar3,local_100,in_RSI,
                       &in_RDI[8]._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = (byte)iVar2;
  }
  else {
    peVar3 = std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )in_stack_fffffffffffffe78);
    iVar2 = (*peVar3->_vptr_Descriptor[6])(peVar3,local_100,in_RSI);
    bVar1 = (byte)iVar2;
  }
  bVar1 = bVar1 & 1;
  FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffe78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::GetDescriptorString(std::string& out, const bool priv) const
{
    LOCK(cs_desc_man);

    FlatSigningProvider provider;
    provider.keys = GetKeys();

    if (priv) {
        // For the private version, always return the master key to avoid
        // exposing child private keys. The risk implications of exposing child
        // private keys together with the parent xpub may be non-obvious for users.
        return m_wallet_descriptor.descriptor->ToPrivateString(provider, out);
    }

    return m_wallet_descriptor.descriptor->ToNormalizedString(provider, out, &m_wallet_descriptor.cache);
}